

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Group.cpp
# Opt level: O2

size_t __thiscall
ezc3d::ParametersNS::GroupNS::Group::parameterIdx(Group *this,string *parameterName)

{
  int iVar1;
  Parameter *this_00;
  string *psVar2;
  invalid_argument *this_01;
  size_t i;
  ulong idx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  idx = 0;
  while( true ) {
    if ((ulong)(((long)(this->_parameters).
                       super__Vector_base<ezc3d::ParametersNS::GroupNS::Parameter,_std::allocator<ezc3d::ParametersNS::GroupNS::Parameter>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->_parameters).
                      super__Vector_base<ezc3d::ParametersNS::GroupNS::Parameter,_std::allocator<ezc3d::ParametersNS::GroupNS::Parameter>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0xb0) <= idx) {
      this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::operator+(&bStack_88,"Group::parameterIdx could not find ",parameterName);
      std::operator+(&local_68,&bStack_88," in the group ");
      std::operator+(&local_48,&local_68,&this->_name);
      std::invalid_argument::invalid_argument(this_01,(string *)&local_48);
      __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    this_00 = parameter(this,idx);
    psVar2 = Parameter::name_abi_cxx11_(this_00);
    iVar1 = std::__cxx11::string::compare((string *)psVar2);
    if (iVar1 == 0) break;
    idx = idx + 1;
  }
  return idx;
}

Assistant:

size_t ezc3d::ParametersNS::GroupNS::Group::parameterIdx(
    const std::string &parameterName) const {
  for (size_t i = 0; i < nbParameters(); ++i)
    if (!parameter(i).name().compare(parameterName))
      return i;
  throw std::invalid_argument("Group::parameterIdx could not find " +
                              parameterName + " in the group " + name());
}